

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Namespace * __thiscall
soul::ResolutionPass::ModuleInstanceResolver::visitModule<soul::AST::Namespace>
          (ModuleInstanceResolver *this,Namespace *m)

{
  bool bVar1;
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  *this_00;
  pool_ref *this_01;
  ASTObject *param;
  pool_ref<soul::AST::ASTObject> *p;
  iterator __end0;
  iterator __begin0;
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  *__range3;
  Namespace *m_local;
  ModuleInstanceResolver *this_local;
  
  bVar1 = AST::ModuleBase::isTemplateModule(&m->super_ModuleBase);
  if (bVar1) {
    RewritingASTVisitor::
    visitArray<std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
              ((RewritingASTVisitor *)this,&(m->super_ModuleBase).specialisationParams);
    this_00 = &(m->super_ModuleBase).specialisationParams;
    __end0 = std::
             vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
             ::begin(this_00);
    p = (pool_ref<soul::AST::ASTObject> *)
        std::
        vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
        ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<soul::pool_ref<soul::AST::ASTObject>_*,_std::vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>_>
                                       *)&p), this_local = (ModuleInstanceResolver *)m, bVar1) {
      this_01 = (pool_ref *)
                __gnu_cxx::
                __normal_iterator<soul::pool_ref<soul::AST::ASTObject>_*,_std::vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>_>
                ::operator*(&__end0);
      param = pool_ref::operator_cast_to_ASTObject_(this_01);
      validateSpecialisationParam
                (this,param,(bool)((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors & 1))
      ;
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::AST::ASTObject>_*,_std::vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>_>
      ::operator++(&__end0);
    }
  }
  else {
    this_local = (ModuleInstanceResolver *)RewritingASTVisitor::visit((RewritingASTVisitor *)this,m)
    ;
  }
  return (Namespace *)this_local;
}

Assistant:

M& visitModule (M& m)
        {
            if (! m.isTemplateModule())
                return super::visit (m);

            visitArray (m.specialisationParams);

            for (auto& p : m.specialisationParams)
                validateSpecialisationParam (p, ignoreErrors);

            return m;
        }